

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O2

Vec_Str_t * Ioa_WriteEncodeLiterals(Vec_Int_t *vLits)

{
  int iVar1;
  uint x;
  int Pos;
  uint uVar2;
  Vec_Str_t *p;
  int i;
  
  p = Vec_StrAlloc(vLits->nSize * 2);
  x = Vec_IntEntry(vLits,0);
  Pos = Ioa_WriteAigerEncode((uchar *)p->pArray,0,x);
  for (i = 1; i < vLits->nSize; i = i + 1) {
    uVar2 = Vec_IntEntry(vLits,i);
    iVar1 = uVar2 - x;
    if ((int)uVar2 < (int)x) {
      iVar1 = -(uVar2 - x);
    }
    Pos = Ioa_WriteAigerEncode((uchar *)p->pArray,Pos,(uint)((int)uVar2 < (int)x) + iVar1 * 2);
    if (p->nCap < Pos + 10) {
      Vec_StrGrow(p,p->nCap + 1);
    }
    x = uVar2;
  }
  p->nSize = Pos;
  return p;
}

Assistant:

Vec_Str_t * Ioa_WriteEncodeLiterals( Vec_Int_t * vLits )
{
    Vec_Str_t * vBinary;
    int Pos = 0, Lit, LitPrev, Diff, i;
    vBinary = Vec_StrAlloc( 2 * Vec_IntSize(vLits) );
    LitPrev = Vec_IntEntry( vLits, 0 );
    Pos = Ioa_WriteAigerEncode( (unsigned char *)Vec_StrArray(vBinary), Pos, LitPrev ); 
    Vec_IntForEachEntryStart( vLits, Lit, i, 1 )
    {
        Diff = Lit - LitPrev;
        Diff = (Lit < LitPrev)? -Diff : Diff;
        Diff = (Diff << 1) | (int)(Lit < LitPrev);
        Pos = Ioa_WriteAigerEncode( (unsigned char *)Vec_StrArray(vBinary), Pos, Diff );
        LitPrev = Lit;
        if ( Pos + 10 > vBinary->nCap )
            Vec_StrGrow( vBinary, vBinary->nCap+1 );
    }
    vBinary->nSize = Pos;
/*
    // verify
    {
        extern Vec_Int_t * Ioa_WriteDecodeLiterals( char ** ppPos, int nEntries );
        char * pPos = Vec_StrArray( vBinary );
        Vec_Int_t * vTemp = Ioa_WriteDecodeLiterals( &pPos, Vec_IntSize(vLits) );
        for ( i = 0; i < Vec_IntSize(vLits); i++ )
        {
            int Entry1 = Vec_IntEntry(vLits,i);
            int Entry2 = Vec_IntEntry(vTemp,i);
            assert( Entry1 == Entry2 );
        }
        Vec_IntFree( vTemp );
    }
*/
    return vBinary;
}